

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

bool __thiscall
bloaty::RangeMap::
TranslateAndTrimRangeWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (RangeMap *this,
          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter,
          uint64_t addr,uint64_t size,uint64_t *trimmed_addr,uint64_t *translated_addr,
          uint64_t *trimmed_size)

{
  unsigned_long uVar1;
  bool bVar2;
  pointer ppVar3;
  unsigned_long *puVar4;
  uint64_t uVar5;
  long in_RCX;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *in_RDI;
  unsigned_long *in_R8;
  uint64_t *in_R9;
  long *in_stack_00000008;
  uint64_t end;
  uint64_t in_stack_ffffffffffffffb0;
  RangeMap *in_stack_ffffffffffffffb8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_ffffffffffffffc0;
  _Base_ptr local_20 [4];
  
  ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->(in_RDI);
  puVar4 = std::max<unsigned_long>((unsigned_long *)local_20,&ppVar3->first);
  local_20[0] = (_Base_ptr)*puVar4;
  *in_R8 = (unsigned_long)local_20[0];
  if (in_RCX == -1) {
    *in_stack_00000008 = -1;
  }
  else {
    in_stack_ffffffffffffffb8 = (RangeMap *)((long)&local_20[0]->_M_color + in_RCX);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
             ::operator->(in_RDI);
    uVar1 = ppVar3->first;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
             ::operator->(in_RDI);
    in_stack_ffffffffffffffb0 = uVar1 + (ppVar3->second).size;
    puVar4 = std::min<unsigned_long>
                       ((unsigned_long *)&stack0xffffffffffffffb8,
                        (unsigned_long *)&stack0xffffffffffffffb0);
    in_stack_ffffffffffffffc0._M_node = (_Base_ptr)*puVar4;
    if (in_stack_ffffffffffffffc0._M_node <= local_20[0]) {
      *in_stack_00000008 = 0;
      return false;
    }
    *in_stack_00000008 = (long)in_stack_ffffffffffffffc0._M_node - (long)local_20[0];
  }
  ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->(in_RDI);
  bVar2 = Entry::HasTranslation(&ppVar3->second);
  if (bVar2) {
    uVar5 = TranslateWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0
                      );
    *in_R9 = uVar5;
  }
  return bVar2;
}

Assistant:

bool RangeMap::TranslateAndTrimRangeWithEntry(T iter, uint64_t addr,
                                              uint64_t size, uint64_t* trimmed_addr,
                                              uint64_t* translated_addr,
                                              uint64_t* trimmed_size) const {
  addr = std::max(addr, iter->first);
  *trimmed_addr = addr;

  if (size == kUnknownSize) {
    *trimmed_size = kUnknownSize;
  } else {
    uint64_t end = std::min(addr + size, iter->first + iter->second.size);
    if (addr >= end) {
      *trimmed_size = 0;
      return false;
    }
    *trimmed_size = end - addr;
  }

  if (!iter->second.HasTranslation()) {
    return false;
  }

  *translated_addr = TranslateWithEntry(iter, addr);
  return true;
}